

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

void __thiscall ApprovalTests::Options::Options(Options *this,Scrubber *scrubber)

{
  Reporter *pRVar1;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RSI;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RDI;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *__x;
  function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *this_00;
  FileOptions *in_stack_ffffffffffffffc0;
  
  __x = in_RDI;
  FileOptions::FileOptions(in_stack_ffffffffffffffc0);
  this_00 = (function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *)
            ((long)&in_RDI[1].super__Function_base._M_functor + 8);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(in_RSI,__x);
  pRVar1 = defaultReporter();
  *(Reporter **)((long)&in_RDI[2].super__Function_base._M_functor + 8) = pRVar1;
  DefaultNamerFactory::getDefaultNamer();
  ::std::function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()>::operator()(this_00);
  ::std::function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()>::~function
            ((function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *)0x1e42b2);
  __x[3].super__Function_base._M_functor._M_pod_data[0] = '\x01';
  __x[3].super__Function_base._M_functor._M_pod_data[0] = '\0';
  return;
}

Assistant:

Options::Options(Scrubber scrubber) : scrubber_(std::move(scrubber))
    {
        usingDefaultScrubber_ = false;
    }